

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O2

void __thiscall
oout::SuiteTest::SuiteTest<oout::EqualTest,oout::EqualTest>
          (SuiteTest *this,shared_ptr<const_oout::Test> *test1,shared_ptr<oout::EqualTest> *tests,
          shared_ptr<oout::EqualTest> *tests_1)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  allocator_type local_69;
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_68;
  __shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_40 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_30 [16];
  
  std::__shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&test1->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<oout::EqualTest,void>
            (local_40,&tests->super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<oout::EqualTest,void>
            (local_30,&tests_1->super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_50;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            ((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              *)&local_68,__l,&local_69);
  SuiteTest(this,(list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
                  *)&local_68);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ::_M_clear(&local_68);
  lVar1 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_50._M_ptr + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}